

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::
     PrintValue<std::__cxx11::list<signed_char,std::allocator<signed_char>>,void>
               (list<signed_char,_std::allocator<signed_char>_> *container,ostream *os)

{
  long lVar1;
  _List_node_base *p_Var2;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  p_Var2 = (container->super__List_base<signed_char,_std::allocator<signed_char>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)container) {
    lVar1 = 0;
    do {
      if ((lVar1 != 0) &&
         (std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1), lVar1 == 0x20)) {
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        goto LAB_001cf1bd;
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
      testing::internal::PrintTo((int)*(char *)&p_Var2[1]._M_next,os);
      lVar1 = lVar1 + 1;
      p_Var2 = (((_List_base<signed_char,_std::allocator<signed_char>_> *)&p_Var2->_M_next)->_M_impl
               )._M_node.super__List_node_base._M_next;
    } while (p_Var2 != (_List_node_base *)container);
    if (lVar1 != 0) {
LAB_001cf1bd:
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }